

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O3

int32_t ucal_getAttribute_63(UCalendar *cal,UCalendarAttribute attr)

{
  UBool UVar1;
  byte bVar2;
  UCalendarWallTimeOption UVar3;
  uint uVar4;
  EDaysOfWeek EVar5;
  
  switch(attr) {
  case UCAL_LENIENT:
    UVar1 = icu_63::Calendar::isLenient((Calendar *)cal);
    uVar4 = (uint)UVar1;
    break;
  case UCAL_FIRST_DAY_OF_WEEK:
    EVar5 = icu_63::Calendar::getFirstDayOfWeek((Calendar *)cal);
    return EVar5;
  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
    bVar2 = icu_63::Calendar::getMinimalDaysInFirstWeek((Calendar *)cal);
    uVar4 = (uint)bVar2;
    break;
  case UCAL_REPEATED_WALL_TIME:
    UVar3 = icu_63::Calendar::getRepeatedWallTimeOption((Calendar *)cal);
    return UVar3;
  case UCAL_SKIPPED_WALL_TIME:
    UVar3 = icu_63::Calendar::getSkippedWallTimeOption((Calendar *)cal);
    return UVar3;
  default:
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getAttribute(    const    UCalendar*              cal,
                  UCalendarAttribute      attr)
{

    switch(attr) {
  case UCAL_LENIENT:
      return ((Calendar*)cal)->isLenient();

  case UCAL_FIRST_DAY_OF_WEEK:
      return ((Calendar*)cal)->getFirstDayOfWeek();

  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
      return ((Calendar*)cal)->getMinimalDaysInFirstWeek();

  case UCAL_REPEATED_WALL_TIME:
      return ((Calendar*)cal)->getRepeatedWallTimeOption();

  case UCAL_SKIPPED_WALL_TIME:
      return ((Calendar*)cal)->getSkippedWallTimeOption();

  default:
      break;
    }
    return -1;
}